

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O2

void __thiscall soplex::SPxSolverBase<double>::setEnterBounds(SPxSolverBase<double> *this)

{
  int iVar1;
  int i;
  long lVar2;
  SPxId base_id;
  DataKey local_40;
  DataKey local_38;
  
  for (lVar2 = 0; lVar2 < (this->thecovectors->set).thenum; lVar2 = lVar2 + 1) {
    local_40 = (this->super_SPxBasisBase<double>).theBaseId.data[lVar2].super_DataKey;
    if (local_40.info < 0) {
      SPxRowId::SPxRowId((SPxRowId *)&local_38,(SPxId *)&local_40);
      iVar1 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                        (&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                          super_SVSetBase<double>.set,&local_38);
      setEnterBound4Row(this,(int)lVar2,iVar1);
    }
    else {
      SPxColId::SPxColId((SPxColId *)&local_38,(SPxId *)&local_40);
      iVar1 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                        (&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                          super_SVSetBase<double>.set,&local_38);
      setEnterBound4Col(this,(int)lVar2,iVar1);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::setEnterBounds()
{

   for(int i = 0; i < dim(); ++i)
   {
      SPxId base_id = this->baseId(i);

      if(base_id.isSPxRowId())
         setEnterBound4Row(i, this->number(SPxRowId(base_id)));
      else
         setEnterBound4Col(i, this->number(SPxColId(base_id)));
   }
}